

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

Vector * OrthoRightKer_VQ(Vector *V,QMatrix *Q)

{
  Real *pRVar1;
  Real *pRVar2;
  Real *pRVar3;
  LASErrIdType LVar4;
  char *pcVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  Real *KerCmp;
  Real *VCmp;
  size_t Ind;
  size_t Dim;
  double Mean;
  double Sum;
  Vector *VRes;
  QMatrix *Q_local;
  Vector *V_local;
  
  V_Lock(V);
  LVar4 = LASResult();
  if (LVar4 == LASOK) {
    Sum = (double)V;
    if ((Q->UnitRightKer != False) || (Q->RightKerCmp != (Real *)0x0)) {
      if ((V->Instance == Normal) && (V->Dim == Q->Dim)) {
        pRVar1 = (Real *)V->Dim;
        pRVar2 = V->Cmp;
        pRVar3 = Q->RightKerCmp;
        if (Q->UnitRightKer == False) {
          Mean = 0.0;
          for (VCmp = (Real *)0x1; VCmp <= pRVar1; VCmp = (Real *)((long)VCmp + 1)) {
            Mean = pRVar2[(long)VCmp] * pRVar3[(long)VCmp] + Mean;
          }
          for (VCmp = (Real *)0x1; VCmp <= pRVar1; VCmp = (Real *)((long)VCmp + 1)) {
            pRVar2[(long)VCmp] = -Mean * pRVar3[(long)VCmp] + pRVar2[(long)VCmp];
          }
        }
        else {
          Mean = 0.0;
          for (VCmp = (Real *)0x1; VCmp <= pRVar1; VCmp = (Real *)((long)VCmp + 1)) {
            Mean = pRVar2[(long)VCmp] + Mean;
          }
          auVar7._8_4_ = (int)((ulong)pRVar1 >> 0x20);
          auVar7._0_8_ = pRVar1;
          auVar7._12_4_ = 0x45300000;
          for (VCmp = (Real *)0x1; VCmp <= pRVar1; VCmp = (Real *)((long)VCmp + 1)) {
            pRVar2[(long)VCmp] =
                 pRVar2[(long)VCmp] -
                 Mean / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)pRVar1) - 4503599627370496.0));
          }
        }
      }
      else {
        if (V->Instance != Normal) {
          pcVar5 = V_GetName(V);
          pcVar6 = Q_GetName(Q);
          LASError(LASLValErr,"OrthoRightKer_VQ",pcVar5,pcVar6,(char *)0x0);
        }
        if (V->Dim != Q->Dim) {
          pcVar5 = V_GetName(V);
          pcVar6 = Q_GetName(Q);
          LASError(LASDimErr,"OrthoRightKer_VQ",pcVar5,pcVar6,(char *)0x0);
        }
        Sum = 0.0;
      }
    }
  }
  else {
    Sum = 0.0;
  }
  V_Unlock(V);
  return (Vector *)Sum;
}

Assistant:

Vector *OrthoRightKer_VQ(Vector *V, QMatrix *Q)
/* orthogonalize vector V to the "right" null space of matrix Q */
{
    Vector *VRes;

    double Sum, Mean;
    size_t Dim, Ind;
    Real *VCmp, *KerCmp;

    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (Q->UnitRightKer || Q->RightKerCmp != NULL) {
            if (V->Instance == Normal && V->Dim == Q->Dim) {
                Dim = V->Dim;
                VCmp = V->Cmp;
                KerCmp = Q->RightKerCmp;
            
                if (Q->UnitRightKer) {
                    Sum = 0.0;
                       for_AllCmp 
                        Sum += VCmp[Ind];
                        Mean = Sum / (double)Dim;
                       for_AllCmp 
                        VCmp[Ind] -= Mean;
                } else {
                    Sum = 0.0;
                       for_AllCmp
                        Sum += VCmp[Ind] * KerCmp[Ind];
                       for_AllCmp 
                        VCmp[Ind] -= Sum * KerCmp[Ind];
                    }           
                       
                VRes = V;
            } else {
                if (V->Instance != Normal) 
                    LASError(LASLValErr, "OrthoRightKer_VQ", V_GetName(V), Q_GetName(Q), NULL);
                if (V->Dim != Q->Dim) 
                    LASError(LASDimErr, "OrthoRightKer_VQ", V_GetName(V), Q_GetName(Q), NULL);
                VRes = NULL;
            }
        } else {
            VRes = V;
        }
    } else {
        VRes = NULL;
    }

    V_Unlock(V);

    return(VRes);
}